

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodecTests.cc
# Opt level: O0

void avro::parsing::add_tests(test_suite *ts)

{
  TestData4 *par_begin;
  test_unit_generator *gen;
  _func_void_TestData4_ptr *in_RDI;
  undefined4 in_stack_fffffffffffff620;
  uint in_stack_fffffffffffff624;
  test_unit_generator *in_stack_fffffffffffff628;
  test_suite *in_stack_fffffffffffff630;
  test_suite *this;
  pointer in_stack_fffffffffffff638;
  basic_cstring<const_char> *in_stack_fffffffffffff640;
  undefined1 *this_00;
  TestData4 *in_stack_fffffffffffff688;
  size_t in_stack_fffffffffffff690;
  basic_cstring<const_char> *this_01;
  const_string *in_stack_fffffffffffff698;
  const_string *tc_file;
  const_string *in_stack_fffffffffffff6a0;
  undefined1 *tc_name;
  _func_void_TestData4_ptr *in_stack_fffffffffffff6a8;
  TestData4 *in_stack_fffffffffffff6c0;
  TestData4 *par_end;
  value_type local_798 [16];
  undefined1 local_788 [176];
  _func_void_TestData3_ptr *local_6d8 [16];
  const_string local_658;
  basic_cstring<const_char> local_648;
  _func_void_TestData_ptr *local_638 [18];
  undefined1 local_5a8 [176];
  _func_void_TestData4_ptr *local_4f8 [18];
  basic_cstring<const_char> local_468;
  _func_void_TestData3_ptr *local_458 [18];
  basic_cstring<const_char> local_3c8;
  _func_void_TestData2_ptr *local_3b8 [18];
  basic_cstring<const_char> local_328;
  _func_void_TestData2_ptr *local_318 [18];
  basic_cstring<const_char> local_288;
  _func_void_TestData_ptr *local_278 [18];
  basic_cstring<const_char> local_1e8;
  _func_void_TestData_ptr *local_1d8 [18];
  basic_cstring<const_char> local_148;
  _func_void_TestData_ptr *local_138 [20];
  basic_cstring<const_char> local_98;
  _func_void_TestData_ptr *local_88 [16];
  _func_void_TestData4_ptr *local_8;
  
  local_88[0] = testCodec<avro::parsing::BinaryCodecFactory>;
  local_8 = in_RDI;
  __avro__parsing__testWithData<void(*)(avro::parsing::TestData_const&),avro::parsing::TestData[82]>_void__const___avro__parsing__TestData_const___avro__parsing__TestData_const____82___
            (local_88,(TestData (*) [82])data);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_98,"testWithData(&testCodec<BinaryCodecFactory>, data)",0x32);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff640,in_stack_fffffffffffff638);
  boost::unit_test::make_test_case<avro::parsing::TestData_const&,avro::parsing::TestData_const*>
            ((_func_void_TestData_ptr *)in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0,
             in_stack_fffffffffffff698,in_stack_fffffffffffff690,
             (TestData *)in_stack_fffffffffffff688,(TestData *)in_stack_fffffffffffff6c0);
  boost::unit_test::test_suite::add
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628,in_stack_fffffffffffff624);
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::parsing::TestData,_const_avro::parsing::TestData_*>::
  ~param_test_case_generator
            ((param_test_case_generator<avro::parsing::TestData,_const_avro::parsing::TestData_*> *)
             CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620));
  local_138[0] = testCodec<avro::parsing::ValidatingCodecFactory>;
  __avro__parsing__testWithData<void(*)(avro::parsing::TestData_const&),avro::parsing::TestData[82]>_void__const___avro__parsing__TestData_const___avro__parsing__TestData_const____82___
            (local_138,(TestData (*) [82])data);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_148,"testWithData(&testCodec<ValidatingCodecFactory>, data)",0x36);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff640,in_stack_fffffffffffff638);
  boost::unit_test::make_test_case<avro::parsing::TestData_const&,avro::parsing::TestData_const*>
            ((_func_void_TestData_ptr *)in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0,
             in_stack_fffffffffffff698,in_stack_fffffffffffff690,
             (TestData *)in_stack_fffffffffffff688,(TestData *)in_stack_fffffffffffff6c0);
  boost::unit_test::test_suite::add
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628,in_stack_fffffffffffff624);
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::parsing::TestData,_const_avro::parsing::TestData_*>::
  ~param_test_case_generator
            ((param_test_case_generator<avro::parsing::TestData,_const_avro::parsing::TestData_*> *)
             CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620));
  local_1d8[0] = testCodec<avro::parsing::JsonCodec>;
  __avro__parsing__testWithData<void(*)(avro::parsing::TestData_const&),avro::parsing::TestData[82]>_void__const___avro__parsing__TestData_const___avro__parsing__TestData_const____82___
            (local_1d8,(TestData (*) [82])data);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_1e8,"testWithData(&testCodec<JsonCodec>, data)",0x29);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff640,in_stack_fffffffffffff638);
  boost::unit_test::make_test_case<avro::parsing::TestData_const&,avro::parsing::TestData_const*>
            ((_func_void_TestData_ptr *)in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0,
             in_stack_fffffffffffff698,in_stack_fffffffffffff690,
             (TestData *)in_stack_fffffffffffff688,(TestData *)in_stack_fffffffffffff6c0);
  boost::unit_test::test_suite::add
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628,in_stack_fffffffffffff624);
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::parsing::TestData,_const_avro::parsing::TestData_*>::
  ~param_test_case_generator
            ((param_test_case_generator<avro::parsing::TestData,_const_avro::parsing::TestData_*> *)
             CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620));
  local_278[0] = testCodec<avro::parsing::BinaryEncoderResolvingDecoderFactory>;
  __avro__parsing__testWithData<void(*)(avro::parsing::TestData_const&),avro::parsing::TestData[82]>_void__const___avro__parsing__TestData_const___avro__parsing__TestData_const____82___
            (local_278,(TestData (*) [82])data);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_288,"testWithData(&testCodec<BinaryEncoderResolvingDecoderFactory>, data)",0x44)
  ;
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff640,in_stack_fffffffffffff638);
  boost::unit_test::make_test_case<avro::parsing::TestData_const&,avro::parsing::TestData_const*>
            ((_func_void_TestData_ptr *)in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0,
             in_stack_fffffffffffff698,in_stack_fffffffffffff690,
             (TestData *)in_stack_fffffffffffff688,(TestData *)in_stack_fffffffffffff6c0);
  boost::unit_test::test_suite::add
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628,in_stack_fffffffffffff624);
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::parsing::TestData,_const_avro::parsing::TestData_*>::
  ~param_test_case_generator
            ((param_test_case_generator<avro::parsing::TestData,_const_avro::parsing::TestData_*> *)
             CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620));
  local_318[0] = testReaderFail<avro::parsing::ValidatingCodecFactory>;
  __avro__parsing__testWithData<void(*)(avro::parsing::TestData2_const&),avro::parsing::TestData2[11]>_void__const___avro__parsing__TestData2_const___avro__parsing__TestData2_const____11___
            (local_318,(TestData2 (*) [11])data2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_328,"testWithData(&testReaderFail<ValidatingCodecFactory>, data2)",0x3c);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff640,in_stack_fffffffffffff638);
  boost::unit_test::make_test_case<avro::parsing::TestData2_const&,avro::parsing::TestData2_const*>
            ((_func_void_TestData2_ptr *)in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0,
             in_stack_fffffffffffff698,in_stack_fffffffffffff690,
             (TestData2 *)in_stack_fffffffffffff688,(TestData2 *)in_stack_fffffffffffff6c0);
  boost::unit_test::test_suite::add
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628,in_stack_fffffffffffff624);
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::parsing::TestData2,_const_avro::parsing::TestData2_*>::
  ~param_test_case_generator
            ((param_test_case_generator<avro::parsing::TestData2,_const_avro::parsing::TestData2_*>
              *)CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620));
  local_3b8[0] = testWriterFail<avro::parsing::ValidatingCodecFactory>;
  __avro__parsing__testWithData<void(*)(avro::parsing::TestData2_const&),avro::parsing::TestData2[11]>_void__const___avro__parsing__TestData2_const___avro__parsing__TestData2_const____11___
            (local_3b8,(TestData2 (*) [11])data2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_3c8,"testWithData(&testWriterFail<ValidatingCodecFactory>, data2)",0x3c);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff640,in_stack_fffffffffffff638);
  boost::unit_test::make_test_case<avro::parsing::TestData2_const&,avro::parsing::TestData2_const*>
            ((_func_void_TestData2_ptr *)in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0,
             in_stack_fffffffffffff698,in_stack_fffffffffffff690,
             (TestData2 *)in_stack_fffffffffffff688,(TestData2 *)in_stack_fffffffffffff6c0);
  boost::unit_test::test_suite::add
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628,in_stack_fffffffffffff624);
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::parsing::TestData2,_const_avro::parsing::TestData2_*>::
  ~param_test_case_generator
            ((param_test_case_generator<avro::parsing::TestData2,_const_avro::parsing::TestData2_*>
              *)CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620));
  local_458[0] = testCodecResolving<avro::parsing::BinaryEncoderResolvingDecoderFactory>;
  __avro__parsing__testWithData<void(*)(avro::parsing::TestData3_const&),avro::parsing::TestData3[34]>_void__const___avro__parsing__TestData3_const___avro__parsing__TestData3_const____34___
            (local_458,(TestData3 (*) [34])data3);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_468,
             "testWithData(&testCodecResolving<BinaryEncoderResolvingDecoderFactory>, data3)",0x4e);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff640,in_stack_fffffffffffff638);
  boost::unit_test::make_test_case<avro::parsing::TestData3_const&,avro::parsing::TestData3_const*>
            ((_func_void_TestData3_ptr *)in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0,
             in_stack_fffffffffffff698,in_stack_fffffffffffff690,
             (TestData3 *)in_stack_fffffffffffff688,(TestData3 *)in_stack_fffffffffffff6c0);
  boost::unit_test::test_suite::add
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628,in_stack_fffffffffffff624);
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::parsing::TestData3,_const_avro::parsing::TestData3_*>::
  ~param_test_case_generator
            ((param_test_case_generator<avro::parsing::TestData3,_const_avro::parsing::TestData3_*>
              *)CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620));
  local_4f8[0] = testCodecResolving2<avro::parsing::BinaryEncoderResolvingDecoderFactory>;
  __avro__parsing__testWithData<void(*)(avro::parsing::TestData4_const&),avro::parsing::TestData4[20]>_void__const___avro__parsing__TestData4_const___avro__parsing__TestData4_const____20___
            (local_4f8,(TestData4 (*) [20])data4);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)(local_5a8 + 0xa0),
             "testWithData(&testCodecResolving2<BinaryEncoderResolvingDecoderFactory>, data4)",0x4f)
  ;
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff640,in_stack_fffffffffffff638);
  boost::unit_test::make_test_case<avro::parsing::TestData4_const&,avro::parsing::TestData4_const*>
            (in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0,in_stack_fffffffffffff698,
             in_stack_fffffffffffff690,in_stack_fffffffffffff688,in_stack_fffffffffffff6c0);
  boost::unit_test::test_suite::add
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628,in_stack_fffffffffffff624);
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::parsing::TestData4,_const_avro::parsing::TestData4_*>::
  ~param_test_case_generator
            ((param_test_case_generator<avro::parsing::TestData4,_const_avro::parsing::TestData4_*>
              *)CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620));
  local_5a8._16_8_ = testCodecResolving2<avro::parsing::ValidatingEncoderResolvingDecoderFactory>;
  __avro__parsing__testWithData<void(*)(avro::parsing::TestData4_const&),avro::parsing::TestData4[20]>_void__const___avro__parsing__TestData4_const___avro__parsing__TestData4_const____20___
            ((_func_void_TestData4_ptr **)(local_5a8 + 0x10),(TestData4 (*) [20])data4);
  par_end = (TestData4 *)local_5a8;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)par_end,
             "testWithData(&testCodecResolving2<ValidatingEncoderResolvingDecoderFactory>, data4)",
             0x53);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff640,in_stack_fffffffffffff638);
  boost::unit_test::make_test_case<avro::parsing::TestData4_const&,avro::parsing::TestData4_const*>
            (in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0,in_stack_fffffffffffff698,
             in_stack_fffffffffffff690,in_stack_fffffffffffff688,par_end);
  boost::unit_test::test_suite::add
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628,in_stack_fffffffffffff624);
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::parsing::TestData4,_const_avro::parsing::TestData4_*>::
  ~param_test_case_generator
            ((param_test_case_generator<avro::parsing::TestData4,_const_avro::parsing::TestData4_*>
              *)CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620));
  local_638[0] = testGeneric<avro::parsing::ValidatingCodecFactory>;
  tc_name = data;
  par_begin = (TestData4 *)
              __avro__parsing__testWithData<void(*)(avro::parsing::TestData_const&),avro::parsing::TestData[82]>_void__const___avro__parsing__TestData_const___avro__parsing__TestData_const____82___
                        (local_638,(TestData (*) [82])data);
  this_01 = &local_648;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (this_01,"testWithData(&testGeneric<ValidatingCodecFactory>, data)",0x38);
  tc_file = &local_658;
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff640,in_stack_fffffffffffff638);
  boost::unit_test::make_test_case<avro::parsing::TestData_const&,avro::parsing::TestData_const*>
            ((_func_void_TestData_ptr *)local_8,(const_string *)tc_name,tc_file,(size_t)this_01,
             (TestData *)par_begin,(TestData *)par_end);
  boost::unit_test::test_suite::add
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628,in_stack_fffffffffffff624);
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::parsing::TestData,_const_avro::parsing::TestData_*>::
  ~param_test_case_generator
            ((param_test_case_generator<avro::parsing::TestData,_const_avro::parsing::TestData_*> *)
             CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620));
  local_6d8[0] = testGenericResolving<avro::parsing::ValidatingCodecFactory>;
  __avro__parsing__testWithData<void(*)(avro::parsing::TestData3_const&),avro::parsing::TestData3[34]>_void__const___avro__parsing__TestData3_const___avro__parsing__TestData3_const____34___
            (local_6d8,(TestData3 (*) [34])data3);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)(local_788 + 0xa0),
             "testWithData(&testGenericResolving<ValidatingCodecFactory>, data3)",0x42);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff640,in_stack_fffffffffffff638);
  boost::unit_test::make_test_case<avro::parsing::TestData3_const&,avro::parsing::TestData3_const*>
            ((_func_void_TestData3_ptr *)local_8,(const_string *)tc_name,tc_file,(size_t)this_01,
             (TestData3 *)par_begin,(TestData3 *)par_end);
  boost::unit_test::test_suite::add
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628,in_stack_fffffffffffff624);
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::parsing::TestData3,_const_avro::parsing::TestData3_*>::
  ~param_test_case_generator
            ((param_test_case_generator<avro::parsing::TestData3,_const_avro::parsing::TestData3_*>
              *)CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620));
  local_788._16_8_ = testGenericResolving2<avro::parsing::ValidatingCodecFactory>;
  this_00 = data4;
  gen = (test_unit_generator *)
        __avro__parsing__testWithData<void(*)(avro::parsing::TestData4_const&),avro::parsing::TestData4[20]>_void__const___avro__parsing__TestData4_const___avro__parsing__TestData4_const____20___
                  ((_func_void_TestData4_ptr **)(local_788 + 0x10),(TestData4 (*) [20])data4);
  this = (test_suite *)local_788;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)this,
             "testWithData(&testGenericResolving2<ValidatingCodecFactory>, data4)",0x43);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)this_00,local_798);
  boost::unit_test::make_test_case<avro::parsing::TestData4_const&,avro::parsing::TestData4_const*>
            (local_8,(const_string *)tc_name,tc_file,(size_t)this_01,par_begin,par_end);
  boost::unit_test::test_suite::add(this,gen,in_stack_fffffffffffff624);
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::parsing::TestData4,_const_avro::parsing::TestData4_*>::
  ~param_test_case_generator
            ((param_test_case_generator<avro::parsing::TestData4,_const_avro::parsing::TestData4_*>
              *)CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620));
  return;
}

Assistant:

void add_tests(boost::unit_test::test_suite& ts)
{
    ADD_TESTS(ts, BinaryCodecFactory, testCodec, data);
    ADD_TESTS(ts, ValidatingCodecFactory, testCodec, data);
    ADD_TESTS(ts, JsonCodec, testCodec, data);
    ADD_TESTS(ts, BinaryEncoderResolvingDecoderFactory, testCodec, data);
    ADD_TESTS(ts, ValidatingCodecFactory, testReaderFail, data2);
    ADD_TESTS(ts, ValidatingCodecFactory, testWriterFail, data2);
    ADD_TESTS(ts, BinaryEncoderResolvingDecoderFactory,
        testCodecResolving, data3);
    ADD_TESTS(ts, BinaryEncoderResolvingDecoderFactory,
        testCodecResolving2, data4);
    ADD_TESTS(ts, ValidatingEncoderResolvingDecoderFactory,
        testCodecResolving2, data4);

    ADD_TESTS(ts, ValidatingCodecFactory, testGeneric, data);
    ADD_TESTS(ts, ValidatingCodecFactory, testGenericResolving, data3);
    ADD_TESTS(ts, ValidatingCodecFactory, testGenericResolving2, data4);
}